

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

MemoryDescr * add_memblock(char *name,lword org,lword len)

{
  MemoryDescr *pMVar1;
  MemoryDescr *pMVar2;
  char *pcVar3;
  long in_RDX;
  long in_RSI;
  MemoryDescr *new;
  MemoryDescr *last;
  size_t in_stack_ffffffffffffffe0;
  MemoryDescr *s;
  long local_18;
  
  pMVar2 = (MemoryDescr *)alloc(in_stack_ffffffffffffffe0);
  pMVar1 = pMVar2;
  s = memory_blocks;
  if (memory_blocks != (MemoryDescr *)0x0) {
    for (; s->next != (MemoryDescr *)0x0; s = s->next) {
    }
    s->next = pMVar2;
    pMVar1 = memory_blocks;
  }
  memory_blocks = pMVar1;
  pMVar2->next = (MemoryDescr *)0x0;
  pcVar3 = allocstring((char *)s);
  pMVar2->name = pcVar3;
  pMVar2->current = in_RSI;
  pMVar2->org = in_RSI;
  local_18 = in_RDX;
  if (in_RSI + in_RDX < in_RSI) {
    local_18 = -1 - in_RSI;
  }
  pMVar2->len = local_18;
  return pMVar2;
}

Assistant:

static struct MemoryDescr *add_memblock(const char *name,lword org,lword len)
{
  struct MemoryDescr *last,*new = alloc(sizeof(struct MemoryDescr));

  if (last = memory_blocks) {
    while (last->next)
      last = last->next;
    last->next = new;
  }
  else
    memory_blocks = new;

  new->next = NULL;
  new->name = allocstring(name);
  new->org = new->current = org;
  if (org+len < org)
    len -= org+len+1;
  new->len = len;
  return new;
}